

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_remove_rangeBeyondBounds_fn(int _i)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"0123456789",0x10);
  private_ACUtilsTest_AString_reallocFail = 0;
  AString_remove(&string,5,100);
  if (string.capacity == 0x10) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1c4);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      string.buffer = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar5 = "(void*) (string).buffer != NULL";
      pcVar6 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x1c4);
      pcVar4 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar4 = "(null)";
      }
      else {
        iVar1 = strcmp("01234",string.buffer);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c4);
          if (string.size != 5) {
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string).size == strlen(\"01234\")";
            pcVar6 = "(string).size";
            string.buffer = "strlen(\"01234\")";
            goto LAB_00122d50;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c4);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            string.buffer = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar6 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0x1c5;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_00122ed5;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c5);
          AString_remove(&string,2,0xffffffffffffffff);
          if (string.capacity == 0x10) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x1c7);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              string.buffer = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar5 = "(void*) (string).buffer != NULL";
              pcVar6 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x1c7);
              if (string.buffer == (char *)0x0) {
                string.buffer = "(null)";
                string.size = 0x16819b;
              }
              else {
                uVar2 = (byte)*string.buffer - 0x30;
                if ((uVar2 == 0) && (uVar2 = (byte)string.buffer[1] - 0x31, uVar2 == 0)) {
                  uVar2 = (uint)(byte)string.buffer[2];
                }
                if (uVar2 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x1c7);
                  if (string.size == 2) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x1c7);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x1c8);
                      (*string.deallocator)(string.buffer);
                      return;
                    }
                    string.buffer = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                    iVar1 = 0x1c8;
                    string.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_00122ed5;
                  }
                  string.buffer = "strlen(\"01\")";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar5 = "(string).size == strlen(\"01\")";
                  pcVar6 = "(string).size";
                  goto LAB_00122ed0;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar5 = "(string).buffer == (\"01\")";
              pcVar6 = "(string).buffer";
            }
          }
          else {
            string.buffer = "(16)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string).capacity == (16)";
            pcVar6 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_00122ed0:
          iVar1 = 0x1c7;
          goto LAB_00122ed5;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar5 = "(string).buffer == (\"01234\")";
      pcVar6 = "(string).buffer";
      string.buffer = pcVar4;
    }
  }
  else {
    string.buffer = "(16)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = "(string).capacity == (16)";
    pcVar6 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_00122d50:
  iVar1 = 0x1c4;
LAB_00122ed5:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar5,pcVar6,string.size,string.buffer);
}

Assistant:

END_TEST
START_TEST(test_AString_remove_rangeBeyondBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("0123456789", 16);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    AString_remove(&string, 5, 100);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    AString_remove(&string, 2, -1);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}